

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O0

type __thiscall
miniros::MessageEvent<std_msgs::Empty_<std::allocator<void>>const>::
copyMessageIfNecessary<std_msgs::Empty_<std::allocator<void>>const>
          (MessageEvent<const_std_msgs::Empty_<std::allocator<void>_>_> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  type tVar1;
  shared_ptr<std_msgs::Empty_<std::allocator<void>_>_> *in_stack_ffffffffffffffc8;
  element_type *peVar2;
  
  peVar2 = in_RDI;
  std::
  const_pointer_cast<std_msgs::Empty_<std::allocator<void>>,std_msgs::Empty_<std::allocator<void>>const>
            ((shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_> *)in_RDI);
  std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>::
  shared_ptr<std_msgs::Empty_<std::allocator<void>>,void>
            ((shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_> *)in_RDI,
             in_stack_ffffffffffffffc8);
  std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>::~shared_ptr
            ((shared_ptr<std_msgs::Empty_<std::allocator<void>_>_> *)0x1e0503);
  tVar1.
  super___shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  tVar1.
  super___shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  return (type)tVar1.
               super___shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename std::enable_if<!std::is_void<M2>::value, std::shared_ptr<M> >::type copyMessageIfNecessary() const
  {
    if (std::is_const<M>::value || !nonconst_need_copy_)
    {
      return std::const_pointer_cast<Message>(message_);
    }

    if (message_copy_)
    {
      return message_copy_;
    }

    assert(create_);
    message_copy_ = create_();
    *message_copy_ = *message_;

    return message_copy_;
  }